

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::coap::Coap::AddResource
          (Error *__return_storage_ptr__,Coap *this,Resource *aResource)

{
  iterator iVar1;
  char *pcVar2;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string local_b0;
  ErrorCode local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  pointer local_68;
  char *pcStack_60;
  size_t local_58;
  undefined8 local_50;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  code *local_40;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource>_>_>
          ::find(&(this->mResources)._M_t,&aResource->mUriPath);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->mResources)._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ot::commissioner::coap::Resource>,std::_Select1st<std::pair<std::__cxx11::string_const,ot::commissioner::coap::Resource>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ot::commissioner::coap::Resource>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,ot::commissioner::coap::Resource_const&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ot::commissioner::coap::Resource>,std::_Select1st<std::pair<std::__cxx11::string_const,ot::commissioner::coap::Resource>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ot::commissioner::coap::Resource>>>
                *)&this->mResources,&aResource->mUriPath,aResource);
  }
  else {
    local_68 = (pointer)CONCAT44(local_68._4_4_,string_type);
    pcStack_60 = "CoAP resource {} already exists";
    local_58 = 0x1f;
    local_50._0_4_ = 0;
    local_50._4_4_ = 1;
    local_40 = ::fmt::v10::detail::
               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    begin = "CoAP resource {} already exists";
    local_48 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_68;
    do {
      pcVar2 = begin + 1;
      if (*begin == '}') {
        if ((pcVar2 == "") || (*pcVar2 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar2 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar2 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (begin,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_68);
      }
      begin = pcVar2;
    } while (pcVar2 != "");
    local_68 = (aResource->mUriPath)._M_dataplus._M_p;
    pcStack_60 = (char *)(aResource->mUriPath)._M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x1f;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_(&local_b0,(v10 *)"CoAP resource {} already exists",fmt,args);
    local_90 = kAlreadyExists;
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,local_b0._M_dataplus._M_p,
               local_b0._M_dataplus._M_p + local_b0._M_string_length);
    __return_storage_ptr__->mCode = local_90;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_88);
    if (local_88[0] != local_78) {
      operator_delete(local_88[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error Coap::AddResource(const Resource &aResource)
{
    Error error;
    auto  res = mResources.find(aResource.GetUriPath());

    if (res != mResources.end())
    {
        ExitNow(error = ERROR_ALREADY_EXISTS("CoAP resource {} already exists", aResource.GetUriPath()));
    }
    mResources.emplace(aResource.GetUriPath(), aResource);

exit:
    return error;
}